

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O0

bool __thiscall Minisat::Solver::addClause_(Solver *this,vec<Minisat::Lit,_int> *ps)

{
  bool bVar1;
  int iVar2;
  Size SVar3;
  CRef CVar4;
  Lit *pLVar5;
  bool local_71;
  bool local_65;
  CRef local_58;
  int local_54;
  CRef cr;
  uint8_t local_49;
  int local_48;
  lbool local_41;
  int local_40;
  int local_3c;
  uint8_t local_35;
  int local_34;
  lbool local_2d;
  int local_2c;
  int local_28;
  int j;
  int i;
  Lit p;
  vec<Minisat::Lit,_int> *ps_local;
  Solver *this_local;
  
  _i = ps;
  iVar2 = decisionLevel(this);
  if (iVar2 != 0) {
    __assert_fail("decisionLevel() == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/core/Solver.cc"
                  ,0x9c,"bool Minisat::Solver::addClause_(vec<Lit> &)");
  }
  if ((this->ok & 1U) == 0) {
    this_local._7_1_ = false;
  }
  else {
    sort<Minisat::Lit>(_i);
    local_2c = 0;
    j = -2;
    for (local_28 = 0; iVar2 = local_28, SVar3 = vec<Minisat::Lit,_int>::size(_i), iVar2 < SVar3;
        local_28 = local_28 + 1) {
      pLVar5 = vec<Minisat::Lit,_int>::operator[](_i,local_28);
      local_34 = pLVar5->x;
      local_2d = value(this,(Lit)local_34);
      local_35 = l_True.value;
      bVar1 = lbool::operator==(&local_2d,l_True);
      local_65 = true;
      if (!bVar1) {
        pLVar5 = vec<Minisat::Lit,_int>::operator[](_i,local_28);
        local_40 = j;
        local_3c = (int)operator~((Lit)j);
        local_65 = Lit::operator==(pLVar5,(Lit)local_3c);
      }
      if (local_65 != false) {
        return true;
      }
      pLVar5 = vec<Minisat::Lit,_int>::operator[](_i,local_28);
      local_48 = pLVar5->x;
      local_41 = value(this,(Lit)local_48);
      local_49 = l_False.value;
      bVar1 = lbool::operator!=(&local_41,l_False);
      local_71 = false;
      if (bVar1) {
        pLVar5 = vec<Minisat::Lit,_int>::operator[](_i,local_28);
        cr = j;
        local_71 = Lit::operator!=(pLVar5,(Lit)j);
      }
      if (local_71 != false) {
        pLVar5 = vec<Minisat::Lit,_int>::operator[](_i,local_28);
        iVar2 = local_2c;
        j = pLVar5->x;
        local_2c = local_2c + 1;
        pLVar5 = vec<Minisat::Lit,_int>::operator[](_i,iVar2);
        pLVar5->x = j;
      }
    }
    vec<Minisat::Lit,_int>::shrink(_i,local_28 - local_2c);
    SVar3 = vec<Minisat::Lit,_int>::size(_i);
    if (SVar3 == 0) {
      this->ok = false;
      this_local._7_1_ = false;
    }
    else {
      SVar3 = vec<Minisat::Lit,_int>::size(_i);
      if (SVar3 == 1) {
        pLVar5 = vec<Minisat::Lit,_int>::operator[](_i,0);
        local_54 = pLVar5->x;
        uncheckedEnqueue(this,(Lit)local_54,0xffffffff);
        CVar4 = propagate(this);
        this_local._7_1_ = CVar4 == 0xffffffff;
        this->ok = this_local._7_1_;
      }
      else {
        local_58 = ClauseAllocator::alloc(&this->ca,_i,false);
        vec<unsigned_int,_int>::push(&this->clauses,&local_58);
        attachClause(this,local_58);
        this_local._7_1_ = true;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Solver::addClause_(vec<Lit>& ps)
{
    assert(decisionLevel() == 0);
    if (!ok) return false;

    // Check if clause is satisfied and remove false/duplicate literals:
    sort(ps);
    Lit p; int i, j;
    for (i = j = 0, p = lit_Undef; i < ps.size(); i++)
        if (value(ps[i]) == l_True || ps[i] == ~p)
            return true;
        else if (value(ps[i]) != l_False && ps[i] != p)
            ps[j++] = p = ps[i];
    ps.shrink(i - j);

    if (ps.size() == 0)
        return ok = false;
    else if (ps.size() == 1){
        uncheckedEnqueue(ps[0]);
        return ok = (propagate() == CRef_Undef);
    }else{
        CRef cr = ca.alloc(ps, false);
        clauses.push(cr);
        attachClause(cr);
    }

    return true;
}